

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ColumnIndex(Table *pTab,char *zCol)

{
  short sVar1;
  u8 uVar2;
  int iVar3;
  int iVar4;
  Column *pCVar5;
  int iVar6;
  
  uVar2 = sqlite3StrIHash(zCol);
  pCVar5 = pTab->aCol;
  sVar1 = pTab->nCol;
  iVar6 = 0;
  while ((iVar4 = -1, iVar6 < sVar1 &&
         ((pCVar5->hName != uVar2 ||
          (iVar3 = sqlite3StrICmp(pCVar5->zCnName,zCol), iVar4 = iVar6, iVar3 != 0))))) {
    pCVar5 = pCVar5 + 1;
    iVar6 = iVar6 + 1;
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnIndex(Table *pTab, const char *zCol){
  int i;
  u8 h = sqlite3StrIHash(zCol);
  Column *pCol;
  for(pCol=pTab->aCol, i=0; i<pTab->nCol; pCol++, i++){
    if( pCol->hName==h && sqlite3StrICmp(pCol->zCnName, zCol)==0 ) return i;
  }
  return -1;
}